

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

int minTemp2_fast_moreThen5(word *pInOut,int iVar,int iQ,int jQ,int nWords,int *pDifStart)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  
  bVar2 = (char)iVar - 6;
  uVar6 = 1 << (bVar2 & 0x1f);
  uVar4 = nWords - 1;
  uVar1 = 0 << (bVar2 & 0x1f);
  if ((int)uVar6 < 1) {
    uVar6 = uVar1;
  }
  do {
    if ((int)uVar4 < 0) {
      iVar5 = 0;
LAB_0048a90e:
      *pDifStart = iVar5;
      return uVar1;
    }
    for (lVar7 = 0; -lVar7 != (ulong)uVar6; lVar7 = lVar7 + -1) {
      iVar3 = -(uint)(pInOut[((ulong)uVar4 + lVar7) - (long)(iQ << (bVar2 & 0x1f))] <
                     pInOut[((ulong)uVar4 + lVar7) - (long)(jQ << (bVar2 & 0x1f))]);
      if (pInOut[((ulong)uVar4 + lVar7) - (long)(jQ << (bVar2 & 0x1f))] <
          pInOut[((ulong)uVar4 + lVar7) - (long)(iQ << (bVar2 & 0x1f))]) {
        iVar3 = 1;
      }
      if (iVar3 != 0) {
        iVar5 = uVar4 + 1;
        if (iVar3 != -1) {
          uVar1 = 1;
        }
        goto LAB_0048a90e;
      }
    }
    uVar4 = uVar4 + (-4 << (bVar2 & 0x1f));
  } while( true );
}

Assistant:

int minTemp2_fast_moreThen5(word* pInOut, int iVar, int iQ, int jQ, int nWords, int* pDifStart)
{
    int i, j, temp;
    int  wordBlock = 1<<(iVar-6);
    int  shiftBlock = wordBlock*4;
//    printf("in minTemp2_fast_moreThen5\n");

    for(i=nWords - 1; i>=0; i-=shiftBlock)
        for(j=0;j<wordBlock;j++)
        {
            temp = CompareWords(pInOut[i-j-iQ*wordBlock],pInOut[i-j-jQ*wordBlock]);
            if(temp == 0)
                continue;
            else if(temp == -1)
            {
                *pDifStart = i+1;
                return 0;
            }
            else
            {
                *pDifStart = i+1;
                return 1;
            }
        }
    *pDifStart=0;
//    printf("out minTemp2_fast_moreThen5\n");
    
    return 0;
}